

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O2

int array_container_shrink_to_fit(array_container_t *src)

{
  int iVar1;
  uint16_t *__ptr;
  int iVar2;
  uint16_t *puVar3;
  int iVar4;
  uint16_t *oldarray;
  
  iVar1 = src->cardinality;
  iVar4 = src->capacity - iVar1;
  iVar2 = 0;
  if (iVar4 != 0) {
    src->capacity = iVar1;
    __ptr = src->array;
    iVar2 = iVar4;
    if (iVar1 == 0) {
      free(__ptr);
      src->array = (uint16_t *)0x0;
    }
    else {
      puVar3 = (uint16_t *)realloc(__ptr,(long)iVar1 * 2);
      src->array = puVar3;
      if (puVar3 == (uint16_t *)0x0) {
        free(__ptr);
      }
    }
  }
  return iVar2;
}

Assistant:

int array_container_shrink_to_fit(array_container_t *src) {
    if (src->cardinality == src->capacity) return 0;  // nothing to do
    int savings = src->capacity - src->cardinality;
    src->capacity = src->cardinality;
    if( src->capacity == 0) { // we do not want to rely on realloc for zero allocs
      free(src->array);
      src->array = NULL;
    } else {
      uint16_t *oldarray = src->array;
      src->array =
        (uint16_t *)realloc(oldarray, src->capacity * sizeof(uint16_t));
      if (src->array == NULL) free(oldarray);  // should never happen?
    }
    return savings;
}